

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakevfs.cpp
# Opt level: O1

bool __thiscall QMakeVfs::exists(QMakeVfs *this,QString *fn,VfsFlags flags)

{
  FileType FVar1;
  
  FVar1 = QMakeInternal::IoUtils::fileType(fn);
  return FVar1 == FileIsRegular;
}

Assistant:

bool QMakeVfs::exists(const QString &fn, VfsFlags flags)
{
#ifndef PROEVALUATOR_FULL
# ifdef PROEVALUATOR_THREAD_SAFE
    QMutexLocker locker(&m_mutex);
# endif
    int id = idForFileName(fn, flags);
    auto it = m_files.constFind(id);
    if (it != m_files.constEnd())
        return it->constData() != m_magicMissing.constData();
#else
    Q_UNUSED(flags);
#endif
    bool ex = IoUtils::fileType(fn) == IoUtils::FileIsRegular;
#ifndef PROEVALUATOR_FULL
    m_files[id] = ex ? m_magicExisting : m_magicMissing;
#endif
    return ex;
}